

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBadTypeAttributes.cpp
# Opt level: O0

void anon_unknown.dwarf_3b1cf::testScanLineWithBadAttribute(char *file)

{
  int iVar1;
  char *in_RDI;
  TiledInputPart p;
  MultiPartInputFile multiin_1;
  TiledInputFile f;
  InputPart ip;
  MultiPartInputFile multiin;
  InputFile in;
  bool caught;
  TiledInputFile local_58 [16];
  InputPart local_48 [8];
  MultiPartInputFile local_40 [31];
  undefined1 in_stack_ffffffffffffffdf;
  InputPart *in_stack_ffffffffffffffe0;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  
  iVar1 = Imf_3_2::globalThreadCount();
  Imf_3_2::InputFile::InputFile((InputFile *)&stack0xffffffffffffffe0,in_RDI,iVar1);
  readScanlineThing<Imf_3_2::InputFile>
            ((InputFile *)in_stack_ffffffffffffffe0,(bool)in_stack_ffffffffffffffdf);
  iVar1 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartInputFile::MultiPartInputFile(local_40,in_RDI,iVar1,true);
  Imf_3_2::InputPart::InputPart(local_48,local_40,0);
  readScanlineThing<Imf_3_2::InputPart>(in_stack_ffffffffffffffe0,(bool)in_stack_ffffffffffffffdf);
  checkDeepTypesFailToLoad((char *)CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0));
  iVar1 = Imf_3_2::globalThreadCount();
  Imf_3_2::TiledInputFile::TiledInputFile(local_58,in_RDI,iVar1);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testBadTypeAttributes.cpp"
                ,0x10e,"void (anonymous namespace)::testScanLineWithBadAttribute(const char *)");
}

Assistant:

void
testScanLineWithBadAttribute (const char* file)
{
    bool caught;

    InputFile in (file);
    readScanlineThing (in, false);

    MultiPartInputFile multiin (file);
    InputPart          ip (multiin, 0);
    readScanlineThing (ip, false);

    checkDeepTypesFailToLoad (file);

    // trying to open it as a tiled file should also fail
    try
    {
        caught = false;
        TiledInputFile f (file);
        assert (false);
    }
    catch (...)
    {
        caught = true;
    }
    assert (caught);

    // trying to open it as a tiled part of a multipart file should fail
    try
    {
        caught = false;
        MultiPartInputFile multiin (file);
        TiledInputPart     p (multiin, 0);
        assert (false);
    }
    catch (...)
    {
        caught = true;
    }
    assert (caught);
}